

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random.c
# Opt level: O0

int main(void)

{
  int iVar1;
  void *__s1;
  void *__s2;
  uint64_t *b2;
  uint64_t *b1;
  size_t count;
  uint64_t q;
  int local_4;
  
  __s1 = calloc(100,8);
  __s2 = calloc(100,8);
  iVar1 = get_random_numbers((uint64_t *)q,count,(uint64_t)b1);
  if (((iVar1 == 0) && (iVar1 = get_random_numbers((uint64_t *)q,count,(uint64_t)b1), iVar1 == 0))
     && (iVar1 = memcmp(__s1,__s2,800), iVar1 != 0)) {
    free(__s1);
    free(__s2);
    local_4 = 0;
  }
  else {
    free(__s1);
    free(__s2);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main() {

    uint64_t q = 765432354334562449;
    size_t count = 100;
    uint64_t* b1 = calloc(count, sizeof(uint64_t));
    uint64_t* b2 = calloc(count, sizeof(uint64_t));

    // try to gather random data

    if(get_random_numbers(b1, count, q) != 0)
        goto error;

    if(get_random_numbers(b2, count, q) != 0)
        goto error;

    // ensure that the two calls haven't returned the same data

    if(memcmp(b1, b2, count*sizeof(uint64_t)) == 0)
        goto error;

    free(b1);
    free(b2);
    return 0;


    error:
        free(b1);
        free(b2);
        return 1;

}